

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_true,_false>::insert_branch_(DaTrie<true,_true,_false> *this,Query *query)

{
  bool bVar1;
  uint8_t label;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  size_type sVar6;
  reference pvVar7;
  char *pcVar8;
  reference pvVar9;
  byte *pbVar10;
  reference pvVar11;
  Query *in_RSI;
  ulong __n;
  DaTrie<true,_true,_false> *in_RDI;
  uint32_t value;
  uint32_t child_pos;
  uint32_t base;
  Edge edge;
  uint8_t branch;
  uint32_t tail_pos;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_stack_fffffffffffffe88;
  vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *this_00;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  byte bVar12;
  DaTrie<true,_true,_false> *in_stack_fffffffffffffe98;
  Edge *this_01;
  undefined4 in_stack_fffffffffffffea8;
  uint32_t uVar13;
  Edge local_120;
  byte local_15;
  uint32_t local_14;
  Query *local_10;
  
  local_10 = in_RSI;
  uVar2 = Query::node_pos(in_RSI);
  sVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(&in_RDI->bc_);
  if (sVar6 <= uVar2) {
    __assert_fail("query.node_pos() < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x1c5,
                  "void ddd::DaTrie<true, true, false>::insert_branch_(Query &) [WithBLM = true, WithNLM = true, Prefix = false]"
                 );
  }
  uVar2 = Query::node_pos(local_10);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar2);
  bVar1 = Bc::is_leaf(pvVar7);
  if (!bVar1) {
    __assert_fail("bc_[query.node_pos()].is_leaf()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x1c6,
                  "void ddd::DaTrie<true, true, false>::insert_branch_(Query &) [WithBLM = true, WithNLM = true, Prefix = false]"
                 );
  }
  uVar2 = Query::node_pos(local_10);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar2);
  local_14 = Bc::value(pvVar7);
  while( true ) {
    pcVar8 = Query::key(local_10);
    uVar2 = (uint32_t)*pcVar8;
    pvVar9 = std::vector<char,_std::allocator<char>_>::operator[](&in_RDI->tail_,(ulong)local_14);
    if (uVar2 != (int)*pvVar9) break;
    append_edge_(in_RDI,(Query *)CONCAT44(uVar2,in_stack_fffffffffffffea8));
    local_14 = local_14 + 1;
    in_RDI->tail_emps_ = in_RDI->tail_emps_ + 1;
  }
  __n = (ulong)local_14;
  local_14 = local_14 + 1;
  pbVar10 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](&in_RDI->tail_,__n);
  local_15 = *pbVar10;
  in_RDI->tail_emps_ = in_RDI->tail_emps_ + 1;
  this_01 = &local_120;
  Edge::Edge(this_01);
  Edge::push(this_01,local_15);
  label = Query::label(local_10);
  Edge::push(this_01,label);
  uVar3 = xcheck_(in_stack_fffffffffffffe98,
                  (Edge *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                  in_stack_fffffffffffffe88);
  uVar13 = uVar3;
  uVar4 = Query::node_pos(local_10);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar4);
  Bc::set_base(pvVar7,uVar3);
  uVar5 = uVar3 ^ local_15;
  fix_(in_RDI,uVar2,(vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)this_01);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar5);
  uVar3 = Query::node_pos(local_10);
  Bc::set_check(pvVar7,uVar3);
  if (local_15 == 0) {
    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x175c39);
    uVar3 = *(uint32_t *)(pcVar8 + local_14);
    pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar5);
    Bc::set_value(pvVar7,uVar3);
    in_RDI->tail_emps_ = in_RDI->tail_emps_ + 4;
  }
  else {
    pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar5);
    Bc::set_value(pvVar7,local_14);
  }
  bVar12 = local_15;
  this_00 = &in_RDI->node_links_;
  uVar3 = Query::node_pos(local_10);
  pvVar11 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                      (this_00,(ulong)uVar3);
  pvVar11->child = bVar12;
  bVar12 = local_15;
  pvVar11 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                      (this_00,(ulong)uVar5);
  pvVar11->sib = bVar12;
  insert_edge_(in_RDI,(Query *)CONCAT44(uVar2,uVar13));
  Edge::~Edge(&local_120);
  return;
}

Assistant:

void insert_branch_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_leaf());

    auto tail_pos = bc_[query.node_pos()].value();

    while (*query.key() == tail_[tail_pos]) {
      append_edge_(query);
      ++tail_pos;
      ++tail_emps_;
    }

    auto branch = static_cast<uint8_t>(tail_[tail_pos++]);
    ++tail_emps_;

    Edge edge;
    edge.push(branch);
    edge.push(query.label());

    auto base = xcheck_(edge, blocks_);
    bc_[query.node_pos()].set_base(base);

    auto child_pos = base ^branch;
    fix_(child_pos, blocks_);

    bc_[child_pos].set_check(query.node_pos());
    if (branch != '\0') {
      bc_[child_pos].set_value(tail_pos);
    } else {
      uint32_t value = 0;
      std::memcpy(&value, tail_.data() + tail_pos, sizeof(uint32_t));
      bc_[child_pos].set_value(value);
      tail_emps_ += sizeof(uint32_t);
    }

    if (WithNLM) {
      node_links_[query.node_pos()].child = branch;
      node_links_[child_pos].sib = branch;
    }
    insert_edge_(query);
  }